

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ::Destroy(SharedPayloadBase *shared)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    ~SharedPayload((SharedPayload<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x17cfd3);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }